

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void invokeProfileCallback(sqlite3 *db,Vdbe *p)

{
  long in_FS_OFFSET;
  sqlite3_int64 iNow;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iNow = (sqlite3_int64)&DAT_aaaaaaaaaaaaaaaa;
  sqlite3OsCurrentTimeInt64(db->pVfs,&iNow);
  if (db->xProfile != (_func_void_void_ptr_char_ptr_u64 *)0x0) {
    (*db->xProfile)(db->pProfileArg,p->zSql,(iNow - p->startTime) * 1000000);
  }
  if ((db->mTrace & 2) != 0) {
    (*(db->trace).xLegacy)((void *)0x2,(char *)db->pTraceArg);
  }
  p->startTime = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static SQLITE_NOINLINE void invokeProfileCallback(sqlite3 *db, Vdbe *p){
  sqlite3_int64 iNow;
  sqlite3_int64 iElapse;
  assert( p->startTime>0 );
  assert( db->init.busy==0 );
  assert( p->zSql!=0 );
  sqlite3OsCurrentTimeInt64(db->pVfs, &iNow);
  iElapse = (iNow - p->startTime)*1000000;
#ifndef SQLITE_OMIT_DEPRECATED
  if( db->xProfile ){
    db->xProfile(db->pProfileArg, p->zSql, iElapse);
  }
#endif
  if( db->mTrace & SQLITE_TRACE_PROFILE ){
    db->trace.xV2(SQLITE_TRACE_PROFILE, db->pTraceArg, p, (void*)&iElapse);
  }
  p->startTime = 0;
}